

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOper.c
# Opt level: O0

Aig_Obj_t * Aig_Oper(Aig_Man_t *p,Aig_Obj_t *p0,Aig_Obj_t *p1,Aig_Type_t Type)

{
  Aig_Type_t Type_local;
  Aig_Obj_t *p1_local;
  Aig_Obj_t *p0_local;
  Aig_Man_t *p_local;
  
  if (Type == AIG_OBJ_AND) {
    p_local = (Aig_Man_t *)Aig_And(p,p0,p1);
  }
  else {
    if (Type != AIG_OBJ_EXOR) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigOper.c"
                    ,0x59,"Aig_Obj_t *Aig_Oper(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)");
    }
    p_local = (Aig_Man_t *)Aig_Exor(p,p0,p1);
  }
  return (Aig_Obj_t *)p_local;
}

Assistant:

Aig_Obj_t * Aig_Oper( Aig_Man_t * p, Aig_Obj_t * p0, Aig_Obj_t * p1, Aig_Type_t Type )
{
    if ( Type == AIG_OBJ_AND )
        return Aig_And( p, p0, p1 );
    if ( Type == AIG_OBJ_EXOR )
        return Aig_Exor( p, p0, p1 );
    assert( 0 );
    return NULL;
}